

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_adjacency_subgraph.cpp
# Opt level: O0

void __thiscall
Adjacency_Subgraph_resize_Test::Adjacency_Subgraph_resize_Test(Adjacency_Subgraph_resize_Test *this)

{
  Adjacency_Subgraph_resize_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Adjacency_Subgraph_resize_Test_001deed8;
  return;
}

Assistant:

TEST(Adjacency_Subgraph, resize) {
  Adjacency_Graph graph = create_graph_saad();
  Adjacency_Subgraph subgraph(graph, {0, 6, 8, 13, 14});
  std::size_t size_edge = subgraph.size_edge();

  // Expand the graph
  subgraph.resize(7);
  EXPECT_FALSE(subgraph.is_parent(graph));
  EXPECT_EQ(subgraph.size_vertex(), 7);
  EXPECT_EQ(subgraph.size_edge(), size_edge);
  EXPECT_EQ(subgraph.local_global(0), 0);
  EXPECT_EQ(subgraph.local_global(1), 6);
  EXPECT_EQ(subgraph.local_global(2), 8);
  EXPECT_EQ(subgraph.local_global(3), 13);
  EXPECT_EQ(subgraph.local_global(4), 14);
  // Vertices after are in an uninitialised state.

  subgraph = Adjacency_Subgraph(graph, {0, 6, 8, 13, 14});

  // Keep the subgraph the same size.
  subgraph.resize(5);
  EXPECT_TRUE(subgraph.is_parent(graph));
  EXPECT_EQ(subgraph.size_vertex(), 5);
  EXPECT_EQ(subgraph.size_edge(), size_edge);
  EXPECT_EQ(subgraph.local_global(0), 0);
  EXPECT_EQ(subgraph.local_global(1), 6);
  EXPECT_EQ(subgraph.local_global(2), 8);
  EXPECT_EQ(subgraph.local_global(3), 13);
  EXPECT_EQ(subgraph.local_global(4), 14);

  // Shrink the subgraph the same size.
  subgraph.resize(3);
  EXPECT_TRUE(subgraph.is_parent(graph));
  EXPECT_EQ(subgraph.size_vertex(), 3);
  EXPECT_EQ(subgraph.size_edge(), 3);
  EXPECT_EQ(subgraph.local_global(0), 0);
  EXPECT_EQ(subgraph.local_global(1), 6);
  EXPECT_EQ(subgraph.local_global(2), 8);
}